

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O3

void __thiscall
ot::commissioner::CommissionerImpl::HandleEnergyReport(CommissionerImpl *this,Request *aRequest)

{
  char cVar1;
  Tlv *pTVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  bool bVar4;
  undefined4 uVar5;
  char *pcVar6;
  mapped_type *pmVar7;
  ByteArray *pBVar8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  char *pcVar9;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  Error error;
  ByteArray energyList;
  ChannelMask channelMask;
  writer write;
  string peerAddr;
  TlvSet tlvSet;
  undefined1 local_178 [8];
  _Alloc_hider _Stack_170;
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_160;
  code *local_150;
  code *local_148;
  string local_140;
  undefined1 local_120 [8];
  _Alloc_hider local_118;
  size_type local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  string local_f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d8;
  ChannelMask local_b8;
  undefined1 local_a0 [32];
  string local_80;
  _Rb_tree<ot::commissioner::tlv::Type,_std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>,_std::_Select1st<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  local_60;
  
  local_118._M_p = (pointer)&local_108;
  local_120._0_4_ = kNone;
  local_110 = 0;
  local_108._M_local_buf[0] = '\0';
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b8.
  super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.
  super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  (*aRequest->mEndpoint->_vptr_Endpoint[3])(local_178);
  Address::ToString_abi_cxx11_(&local_80,(Address *)local_178);
  if ((type  [2])local_178 != (type  [2])0x0) {
    operator_delete((void *)local_178);
  }
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"mgmt","");
  local_178._0_4_ = string_type;
  pcVar6 = "received MGMT_ED_REPORT.ans from {}";
  _Stack_170._M_p = "received MGMT_ED_REPORT.ans from {}";
  local_168 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x23;
  aStack_160._M_allocated_capacity = 0x100000000;
  local_150 = ::fmt::v10::detail::
              parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
  ;
  aStack_160._8_8_ = local_178;
  local_a0._0_8_ =
       (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)local_178;
  do {
    cVar1 = *pcVar6;
    pcVar9 = pcVar6;
    while (cVar1 != '{') {
      pcVar9 = pcVar9 + 1;
      if (pcVar9 == "") {
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::writer::operator()((writer *)local_a0,pcVar6,"");
        goto LAB_001a239c;
      }
      cVar1 = *pcVar9;
    }
    ::fmt::v10::detail::
    parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::writer::operator()((writer *)local_a0,pcVar6,pcVar9);
    pcVar6 = ::fmt::v10::detail::
             parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                       (pcVar9,"",(format_string_checker<char> *)local_178);
  } while (pcVar6 != "");
LAB_001a239c:
  local_178 = (undefined1  [8])local_80._M_dataplus._M_p;
  _Stack_170._M_p = (pointer)local_80._M_string_length;
  fmt.size_ = 0xd;
  fmt.data_ = (char *)0x23;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)local_178;
  ::fmt::v10::vformat_abi_cxx11_(&local_f8,(v10 *)"received MGMT_ED_REPORT.ans from {}",fmt,args);
  Log(kInfo,&local_140,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  ProxyClient::SendEmptyChanged(&this->mProxyClient,aRequest);
  tlv::GetTlvSet((Error *)local_178,(TlvSet *)&local_60,&aRequest->mPayload,kMeshCoP);
  local_120._0_4_ = local_178._0_4_;
  std::__cxx11::string::operator=((string *)&local_118,(string *)&_Stack_170);
  uVar5 = local_120._0_4_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Stack_170._M_p != &aStack_160) {
    operator_delete(_Stack_170._M_p);
  }
  if (uVar5 != none_type) goto LAB_001a2592;
  local_178[0] = 0x35;
  pmVar7 = std::
           map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
           ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                         *)&local_60,local_178);
  pTVar2 = (pmVar7->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  p_Var3 = (pmVar7->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  if (pTVar2 == (Tlv *)0x0) {
LAB_001a24fe:
    bVar4 = true;
  }
  else {
    pBVar8 = tlv::Tlv::GetValue(pTVar2);
    DecodeChannelMask((Error *)local_178,&local_b8,pBVar8);
    local_120._0_4_ = local_178._0_4_;
    std::__cxx11::string::operator=((string *)&local_118,(string *)&_Stack_170);
    uVar5 = local_120._0_4_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Stack_170._M_p != &aStack_160) {
      operator_delete(_Stack_170._M_p);
    }
    if (uVar5 == none_type) goto LAB_001a24fe;
    bVar4 = false;
  }
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  if (bVar4) {
    local_178[0] = 0x39;
    pmVar7 = std::
             map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
             ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                           *)&local_60,local_178);
    pTVar2 = (pmVar7->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    p_Var3 = (pmVar7->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    if (pTVar2 != (Tlv *)0x0) {
      pBVar8 = tlv::Tlv::GetValue(pTVar2);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&local_d8,pBVar8);
    }
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    (*this->mCommissionerHandler->_vptr_CommissionerHandler[5])
              (this->mCommissionerHandler,&local_80,&local_b8,&local_d8);
  }
LAB_001a2592:
  if (local_120._0_4_ != none_type) {
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"mgmt","");
    local_178._0_4_ = string_type;
    local_178._4_4_ = string_type;
    pcVar6 = "handle MGMT_ED_REPORT.ans from {} failed: {}";
    _Stack_170._M_p = "handle MGMT_ED_REPORT.ans from {} failed: {}";
    local_168 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x2c;
    aStack_160._M_allocated_capacity = 0x200000000;
    local_150 = ::fmt::v10::detail::
                parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
    ;
    local_148 = ::fmt::v10::detail::
                parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
    ;
    aStack_160._8_8_ = local_178;
    local_a0._0_8_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_178;
    do {
      cVar1 = *pcVar6;
      pcVar9 = pcVar6;
      while (cVar1 != '{') {
        pcVar9 = pcVar9 + 1;
        if (pcVar9 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::writer::operator()((writer *)local_a0,pcVar6,"");
          goto LAB_001a2669;
        }
        cVar1 = *pcVar9;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::writer::operator()((writer *)local_a0,pcVar6,pcVar9);
      pcVar6 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,std::__cxx11::string>&>
                         (pcVar9,"",
                          (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_178);
    } while (pcVar6 != "");
LAB_001a2669:
    Error::ToString_abi_cxx11_((string *)local_a0,(Error *)local_120);
    local_178 = (undefined1  [8])local_80._M_dataplus._M_p;
    _Stack_170._M_p = (pointer)local_80._M_string_length;
    local_168 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_a0._0_8_;
    aStack_160._M_allocated_capacity = local_a0._8_8_;
    fmt_00.size_ = 0xdd;
    fmt_00.data_ = (char *)0x2c;
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)local_178;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_f8,(v10 *)"handle MGMT_ED_REPORT.ans from {} failed: {}",fmt_00,args_00);
    Log(kWarn,&local_140,&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    if ((format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)local_a0._0_8_ !=
        (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_a0 + 0x10)) {
      operator_delete((void *)local_a0._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if (local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>::
  ~vector(&local_b8);
  std::
  _Rb_tree<ot::commissioner::tlv::Type,_std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>,_std::_Select1st<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  ::~_Rb_tree(&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_p != &local_108) {
    operator_delete(local_118._M_p);
  }
  return;
}

Assistant:

void CommissionerImpl::HandleEnergyReport(const coap::Request &aRequest)
{
    Error       error;
    tlv::TlvSet tlvSet;
    ChannelMask channelMask;
    ByteArray   energyList;
    std::string peerAddr = aRequest.GetEndpoint()->GetPeerAddr().ToString();

    LOG_INFO(LOG_REGION_MGMT, "received MGMT_ED_REPORT.ans from {}", peerAddr);

    mProxyClient.SendEmptyChanged(aRequest);

    SuccessOrExit(error = GetTlvSet(tlvSet, aRequest));
    if (auto channelMaskTlv = tlvSet[tlv::Type::kChannelMask])
    {
        SuccessOrExit(error = DecodeChannelMask(channelMask, channelMaskTlv->GetValue()));
    }
    if (auto eneryListTlv = tlvSet[tlv::Type::kEnergyList])
    {
        energyList = eneryListTlv->GetValue();
    }

    mCommissionerHandler.OnEnergyReport(peerAddr, channelMask, energyList);

exit:
    if (error != ErrorCode::kNone)
    {
        LOG_WARN(LOG_REGION_MGMT, "handle MGMT_ED_REPORT.ans from {} failed: {}", peerAddr, error.ToString());
    }
}